

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O0

void __thiscall trento::Output::Output(Output *this,VarMap *var_map)

{
  string_type sVar1;
  int iVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  byte bVar6;
  int *piVar7;
  path *path;
  size_type sVar8;
  path *ppVar9;
  runtime_error *prVar10;
  vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  *this_00;
  anon_class_40_3_2e487188 *in_RDI;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  bool header;
  path *output_path;
  int width;
  int nevents;
  string *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffdb0;
  undefined6 in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  allocator local_139;
  string local_138 [38];
  byte local_112;
  undefined1 local_111;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  path *local_a8;
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  undefined1 extraout_var [56];
  
  std::
  vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
  ::vector((vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
            *)0x149b37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"number-events",&local_39);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98);
  piVar7 = boost::program_options::variable_value::as<int>((variable_value *)0x149ba6);
  iVar2 = *piVar7;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = iVar2;
  auVar11._0_8_ = std::log10<int>(0);
  auVar11._8_56_ = extraout_var;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._0_8_;
  auVar12 = vroundsd_avx(auVar11._0_16_,auVar12,10);
  local_50 = (int)auVar12._0_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"quiet",&local_71);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98);
  path = (path *)boost::program_options::variable_value::as<bool>((variable_value *)0x149c89);
  sVar1 = path->m_pathname;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if ((((byte)sVar1 ^ 0xff) & 1) != 0) {
    local_78 = local_50;
    std::
    vector<std::function<void(int,double,int,trento::Event_const&)>,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
    ::emplace_back<trento::Output::Output(boost::program_options::variables_map_const&)::__0>
              ((vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                *)in_stack_fffffffffffffdb0,(anon_class_4_1_a8d81ce6 *)in_stack_fffffffffffffda8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"output",&local_99);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (sVar8 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"output",&local_c9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    ppVar9 = boost::program_options::variable_value::as<boost::filesystem::path>
                       ((variable_value *)0x149e94);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_a8 = ppVar9;
    bVar3 = hdf5::filename_is_hdf5(path);
    if (bVar3) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"HDF5 output was not compiled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = boost::filesystem::exists
                      ((path *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    if ((bool)uVar4) {
      uVar5 = boost::filesystem::is_empty((path *)0x14a004);
      if (!(bool)uVar5) {
        local_111 = 1;
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        boost::filesystem::path::string_abi_cxx11_(local_a8);
        std::operator+(in_stack_fffffffffffffde8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar4,CONCAT16(uVar5,in_stack_fffffffffffffde0)));
        std::operator+(in_stack_fffffffffffffda8,
                       (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
        std::runtime_error::runtime_error(prVar10,local_f0);
        local_111 = 0;
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      boost::filesystem::create_directories((path *)0x14a139);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"no-header",&local_139);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    this_00 = (vector<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
               *)boost::program_options::variable_value::as<bool>((variable_value *)0x14a19a);
    bVar6 = ~*(bool *)&(this_00->
                       super__Vector_base<std::function<void_(int,_double,_int,_const_trento::Event_&)>,_std::allocator<std::function<void_(int,_double,_int,_const_trento::Event_&)>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    local_112 = bVar6 & 1;
    boost::filesystem::path::path
              ((path *)CONCAT17(bVar6,in_stack_fffffffffffffda0),(path *)in_stack_fffffffffffffd98);
    std::
    vector<std::function<void(int,double,int,trento::Event_const&)>,std::allocator<std::function<void(int,double,int,trento::Event_const&)>>>
    ::emplace_back<trento::Output::Output(boost::program_options::variables_map_const&)::__1>
              (this_00,in_RDI);
    Output(boost::program_options::variables_map_const&)::$_1::~__1
              ((anon_class_40_3_2e487188 *)0x14a239);
  }
  return;
}

Assistant:

Output::Output(const VarMap& var_map) {
  // Determine the required width (padding) of the event number.  For example if
  // there are 10 events, the numbers are 0-9 and so no padding is necessary.
  // However given 11 events, the numbers are 00-10 with padded 00, 01, ...
  auto nevents = var_map["number-events"].as<int>();
  auto width = static_cast<int>(std::ceil(std::log10(nevents)));

  // Write to stdout unless the quiet option was specified.
  if (!var_map["quiet"].as<bool>()) {
    writers_.emplace_back(
      [width](int num, double impact_param, int ncoll, const Event& event) {
        write_stream(std::cout, width, num, impact_param, ncoll, event);
      }
    );
  }

  // Possibly write to text or HDF5 files.
  if (var_map.count("output")) {
    const auto& output_path = var_map["output"].as<fs::path>();
    if (hdf5::filename_is_hdf5(output_path)) {
#ifdef TRENTO_HDF5
      if (fs::exists(output_path) && !fs::is_empty(output_path))
        throw std::runtime_error{"file '" + output_path.string() +
                                 "' exists, will not overwrite"};
      writers_.emplace_back(HDF5Writer{output_path});
#else
      throw std::runtime_error{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
    } else {
      // Text files are all written into a single directory.  Require the
      // directory to be initially empty to avoid accidental overwriting and/or
      // spewing files into an already-used location.  If the directory does not
      // exist, create it.
      if (fs::exists(output_path)) {
        if (!fs::is_empty(output_path)) {
          throw std::runtime_error{"output directory '" + output_path.string() +
                                   "' must be empty"};
        }
      } else {
        fs::create_directories(output_path);
      }
      auto header = !var_map["no-header"].as<bool>();
      writers_.emplace_back(
        [output_path, width, header](int num, double impact_param,
          int ncoll, const Event& event) {
          write_text_file(output_path, width, num,
              impact_param, ncoll, event, header);
        }
      );
    }
  }
}